

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O1

void __thiscall MinVR::VRGraphicsWindowNode::~VRGraphicsWindowNode(VRGraphicsWindowNode *this)

{
  ~VRGraphicsWindowNode(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

VRGraphicsWindowNode::~VRGraphicsWindowNode() {
}